

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

void ZSTD_fillHashTable(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,void *end,
                       ZSTD_dictTableLoadMethod_e dtlm)

{
  uint uVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  bool bVar10;
  
  pBVar2 = (ms->window).base;
  uVar7 = (ulong)ms->nextToUpdate;
  if (pBVar2 + uVar7 + 2 <= (BYTE *)((long)end - 8U)) {
    pUVar3 = ms->hashTable;
    uVar1 = cParams->searchLength;
    cVar4 = (char)cParams->hashLog;
    pBVar8 = pBVar2 + uVar7;
    do {
      uVar6 = 0;
      do {
        switch(uVar1) {
        case 5:
          uVar5 = *(long *)(pBVar2 + uVar6 + uVar7) * -0x30e4432345000000;
          break;
        case 6:
          uVar5 = *(long *)(pBVar2 + uVar6 + uVar7) * -0x30e4432340650000;
          break;
        case 7:
          uVar5 = *(long *)(pBVar2 + uVar6 + uVar7) * -0x30e44323405a9d00;
          break;
        case 8:
          uVar5 = *(long *)(pBVar2 + uVar6 + uVar7) * -0x30e44323485a9b9d;
          break;
        default:
          uVar5 = (ulong)((uint)(*(int *)(pBVar2 + uVar6 + uVar7) * -0x61c8864f) >>
                         (0x20U - cVar4 & 0x1f));
          goto LAB_00161655;
        }
        uVar5 = uVar5 >> (0x40U - cVar4 & 0x3f);
LAB_00161655:
        if ((uVar6 == 0) || (pUVar3[uVar5] == 0)) {
          pUVar3[uVar5] = (int)uVar7 + (int)uVar6;
        }
      } while ((dtlm != ZSTD_dtlm_fast) && (bVar10 = uVar6 < 2, uVar6 = uVar6 + 1, bVar10));
      pBVar9 = pBVar8 + 5;
      uVar7 = uVar7 + 3;
      pBVar8 = pBVar8 + 3;
    } while (pBVar9 <= (BYTE *)((long)end - 8U));
  }
  return;
}

Assistant:

void ZSTD_fillHashTable(ZSTD_matchState_t* ms,
                        ZSTD_compressionParameters const* cParams,
                        void const* end, ZSTD_dictTableLoadMethod_e dtlm)
{
    U32* const hashTable = ms->hashTable;
    U32  const hBits = cParams->hashLog;
    U32  const mls = cParams->searchLength;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash table.
     * Insert the other positions if their hash entry is empty.
     */
    for (; ip + fastHashFillStep - 1 <= iend; ip += fastHashFillStep) {
        U32 const current = (U32)(ip - base);
        U32 i;
        for (i = 0; i < fastHashFillStep; ++i) {
            size_t const hash = ZSTD_hashPtr(ip + i, hBits, mls);
            if (i == 0 || hashTable[hash] == 0)
                hashTable[hash] = current + i;
            /* Only load extra positions for ZSTD_dtlm_full */
            if (dtlm == ZSTD_dtlm_fast)
                break;
        }
    }
}